

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

void __thiscall Compiler::Compiler(Compiler *this,string *_filePath)

{
  pointer pcVar1;
  Lexer *this_00;
  Parser *this_01;
  string local_48;
  
  (this->filePath)._M_dataplus._M_p = (pointer)&(this->filePath).field_2;
  (this->filePath)._M_string_length = 0;
  (this->filePath).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&this->filePath,(string *)_filePath);
  this_00 = (Lexer *)operator_new(0x60);
  Lexer::Lexer(this_00);
  this->lexer = this_00;
  pcVar1 = (this->filePath)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (this->filePath)._M_string_length);
  Lexer::lex(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  this_01 = (Parser *)operator_new(0x20);
  Syntax::Parser::Parser(this_01,this->lexer);
  this->parser = this_01;
  this->symTabGenerator = (STGV *)0x0;
  this->typeChecker = (TCV *)0x0;
  return;
}

Assistant:

Compiler::Compiler(std::string _filePath) {
    this->filePath = std::move(_filePath);
    this->lexer = new Lexer();
    lexer->lex(filePath);
    this->parser = new Syntax::Parser(lexer);
    this->symTabGenerator = nullptr;
    this->typeChecker = nullptr;
}